

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O3

void re2::RE2CL8622304(void)

{
  bool bVar1;
  int iVar2;
  string key;
  string val;
  string dir;
  Arg *args [1];
  StringPiece local_258;
  char local_248 [16];
  Arg local_238;
  undefined1 local_228 [16];
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208 [16];
  StringPiece local_1f8;
  LogMessage local_1e8;
  Arg *local_68;
  Arg **local_60;
  Arg *local_50;
  code *local_48;
  Arg local_40;
  
  local_210 = 0;
  local_208[0] = 0;
  local_218 = local_208;
  RE2::RE2((RE2 *)&local_1e8,"([^\\\\])");
  local_258.ptr_ = "D";
  local_258.length_ = 1;
  bVar1 = RE2::FullMatchN(&local_258,(RE2 *)&local_1e8,(Arg **)0x0,0);
  RE2::~RE2((RE2 *)&local_1e8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4e2,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8.str_,"Check failed: RE2::FullMatch(\"D\", \"([^\\\\\\\\])\")",
               0x2e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e8);
  }
  RE2::RE2((RE2 *)&local_1e8,"([^\\\\])");
  local_238.arg_ = &local_218;
  local_238.parser_ = RE2::Arg::parse_string;
  local_258.ptr_ = "D";
  local_258.length_ = 1;
  local_1f8.ptr_ = (char *)&local_238;
  bVar1 = RE2::FullMatchN(&local_258,(RE2 *)&local_1e8,(Arg **)&local_1f8,1);
  RE2::~RE2((RE2 *)&local_1e8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4e3,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8.str_,
               "Check failed: RE2::FullMatch(\"D\", \"([^\\\\\\\\])\", &dir)",0x34);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e8);
  }
  local_258.length_ = 0;
  local_258._12_4_ = 0;
  local_248[0] = '\0';
  local_238.parser_ = (Parser)0x0;
  local_228[0] = 0;
  local_258.ptr_ = local_248;
  local_238.arg_ = local_228;
  RE2::RE2((RE2 *)&local_1e8,"(\\w+)(?::((?:[^;\\\\]|\\\\.)*))?;?");
  local_68 = &local_40;
  local_40.parser_ = RE2::Arg::parse_string;
  local_60 = &local_50;
  local_48 = RE2::Arg::parse_string;
  local_1f8.ptr_ = "bar:1,0x2F,030,4,5;baz:true;fooby:false,true";
  local_1f8.length_ = 0x2c;
  local_50 = &local_238;
  local_40.arg_ = &local_258;
  bVar1 = RE2::PartialMatchN(&local_1f8,(RE2 *)&local_1e8,&local_68,2);
  RE2::~RE2((RE2 *)&local_1e8);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4ea,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8.str_,
               "Check failed: RE2::PartialMatch(\"bar:1,0x2F,030,4,5;baz:true;fooby:false,true\", \"(\\\\w+)(?::((?:[^;\\\\\\\\]|\\\\\\\\.)*))?;?\", &key, &val)"
               ,0x82);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e8);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_258);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4eb,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8.str_,"Check failed: (key) == (\"bar\")",0x1e);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e8);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_238);
  if (iVar2 != 0) {
    LogMessage::LogMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x4ec,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1e8.str_,"Check failed: (val) == (\"1,0x2F,030,4,5\")",0x29);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e8);
  }
  if ((undefined1 *)local_238.arg_ != local_228) {
    operator_delete(local_238.arg_);
  }
  if (local_258.ptr_ != local_248) {
    operator_delete(local_258.ptr_);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  return;
}

Assistant:

TEST(CheckRewriteString, all) {
  TestCheckRewriteString("abc", "foo", true);
  TestCheckRewriteString("abc", "foo\\", false);
  TestCheckRewriteString("abc", "foo\\0bar", true);

  TestCheckRewriteString("a(b)c", "foo", true);
  TestCheckRewriteString("a(b)c", "foo\\0bar", true);
  TestCheckRewriteString("a(b)c", "foo\\1bar", true);
  TestCheckRewriteString("a(b)c", "foo\\2bar", false);
  TestCheckRewriteString("a(b)c", "f\\\\2o\\1o", true);

  TestCheckRewriteString("a(b)(c)", "foo\\12", true);
  TestCheckRewriteString("a(b)(c)", "f\\2o\\1o", true);
  TestCheckRewriteString("a(b)(c)", "f\\oo\\1", false);
}